

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O0

Result __thiscall Kernel::LPO::comparePredicates(LPO *this,Literal *l1,Literal *l2)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  Result RVar4;
  int iVar5;
  int iVar6;
  TermList *pTVar7;
  Term *in_RDX;
  Term *in_RSI;
  long *in_RDI;
  Result res;
  uint i;
  uint p2;
  uint p1;
  PrecedenceOrdering *in_stack_ffffffffffffffc0;
  uint local_2c;
  Result local_4;
  
  uVar2 = Term::functor(in_RSI);
  uVar3 = Term::functor(in_RDX);
  if (uVar2 == uVar3) {
    for (local_2c = 0; uVar2 = Term::arity(in_RSI), local_2c < uVar2; local_2c = local_2c + 1) {
      pTVar7 = Term::nthArgument(in_RSI,local_2c);
      uVar1 = pTVar7->_content;
      pTVar7 = Term::nthArgument(in_RDX,local_2c);
      RVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,uVar1,pTVar7->_content);
      if (RVar4 != EQUAL) {
        return RVar4;
      }
    }
    local_4 = EQUAL;
  }
  else {
    uVar2 = (uint)((ulong)in_RDI >> 0x20);
    iVar5 = PrecedenceOrdering::predicatePrecedence(in_stack_ffffffffffffffc0,uVar2);
    iVar6 = PrecedenceOrdering::predicatePrecedence(in_stack_ffffffffffffffc0,uVar2);
    local_4 = LESS;
    if (iVar6 < iVar5) {
      local_4 = GREATER;
    }
  }
  return local_4;
}

Assistant:

Ordering::Result LPO::comparePredicates(Literal* l1, Literal *l2) const
{
  ASS(l1->shared());
  ASS(l2->shared());
  ASS(!l1->isEquality());
  ASS(!l2->isEquality());

  unsigned p1 = l1->functor();
  unsigned p2 = l2->functor();

  if (p1 == p2) {
    ASS_EQ(l1->isNegative(), l1->isNegative()) // this assertion is meaningless. 
    //maybe:  ASS_EQ(l1->isNegative(), l2->isNegative())

    // compare arguments in lexicographic order
    for (unsigned i = 0; i < l1->arity(); i++) {
      Result res = compare(*l1->nthArgument(i), *l2->nthArgument(i));
      if (res != EQUAL)
        return res;
    }
    return EQUAL;
  }

  ASS_NEQ(predicatePrecedence(p1), predicatePrecedence(p2)); // precedence should be total
  return (predicatePrecedence(p1) > predicatePrecedence(p2)) ? GREATER : LESS;
}